

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qmenu.cpp
# Opt level: O0

void QMenu::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined8 uVar1;
  bool bVar2;
  QMenuPrivate *this;
  QMenu *pQVar3;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  long in_FS_OFFSET;
  void *_v_1;
  void *_v;
  QMenu *_t;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  QMenuPrivate *in_stack_ffffffffffffff20;
  QMenuPrivate *in_stack_ffffffffffffff28;
  undefined1 collapse;
  undefined4 in_stack_ffffffffffffff30;
  uint in_stack_ffffffffffffff34;
  QMenu *in_stack_ffffffffffffff88;
  QIcon local_50 [4];
  QMetaTypeInterface *local_30;
  QMetaType local_28;
  QMetaTypeInterface *local_20;
  QMetaType local_18;
  QMetaType local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    switch(in_EDX) {
    case 0:
      aboutToShow((QMenu *)0x64e82b);
      break;
    case 1:
      aboutToHide((QMenu *)0x64e83a);
      break;
    case 2:
      triggered((QMenu *)0x64e858,
                (QAction *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
      break;
    case 3:
      hovered((QMenu *)0x64e873,
              (QAction *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
      break;
    case 4:
      internalDelayedPopup(in_stack_ffffffffffffff88);
      break;
    case 5:
      d_func((QMenu *)0x64e88b);
      QMenuPrivate::_q_actionTriggered(in_stack_ffffffffffffff28);
      break;
    case 6:
      d_func((QMenu *)0x64e89f);
      QMenuPrivate::_q_actionHovered(in_stack_ffffffffffffff20);
      break;
    case 7:
      this = d_func((QMenu *)0x64e8b3);
      QMenuPrivate::_q_overrideMenuActionDestroyed(this);
      break;
    case 8:
      d_func((QMenu *)0x64e8c7);
      QMenuPrivate::_q_platformMenuAboutToShow(in_stack_ffffffffffffff20);
    }
  }
  collapse = (undefined1)((ulong)in_stack_ffffffffffffff28 >> 0x38);
  if (in_ESI == 7) {
    in_stack_ffffffffffffff34 = in_EDX;
    if (in_EDX == 2) {
      if (**(int **)(in_RCX + 8) == 0) {
        local_20 = (QMetaTypeInterface *)QMetaType::fromType<QAction*>();
        **(undefined8 **)in_RCX = local_20;
      }
      else {
        memset(&local_18,0,8);
        QMetaType::QMetaType(&local_18);
        **(undefined8 **)in_RCX = local_18.d_ptr;
      }
    }
    else if (in_EDX == 3) {
      if (**(int **)(in_RCX + 8) == 0) {
        local_30 = (QMetaTypeInterface *)QMetaType::fromType<QAction*>();
        **(undefined8 **)in_RCX = local_30;
      }
      else {
        memset(&local_28,0,8);
        QMetaType::QMetaType(&local_28);
        **(undefined8 **)in_RCX = local_28.d_ptr;
      }
    }
    else {
      memset(&local_10,0,8);
      QMetaType::QMetaType(&local_10);
      **(undefined8 **)in_RCX = local_10.d_ptr;
    }
  }
  if ((in_ESI != 5) ||
     ((((bVar2 = QtMocHelpers::indexOfMethod<void(QMenu::*)()>(in_RCX,(void **)aboutToShow,0,0),
        !bVar2 && (bVar2 = QtMocHelpers::indexOfMethod<void(QMenu::*)()>
                                     (in_RCX,(void **)aboutToHide,0,1), !bVar2)) &&
       (bVar2 = QtMocHelpers::indexOfMethod<void(QMenu::*)(QAction*)>(in_RCX,(void **)triggered,0,2)
       , !bVar2)) &&
      (bVar2 = QtMocHelpers::indexOfMethod<void(QMenu::*)(QAction*)>(in_RCX,(void **)hovered,0,3),
      !bVar2)))) {
    if (in_ESI == 1) {
      uVar1 = *(undefined8 *)in_RCX;
      pQVar3 = (QMenu *)(ulong)in_EDX;
      switch(pQVar3) {
      case (QMenu *)0x0:
        bVar2 = isTearOffEnabled((QMenu *)0x64eb77);
        *(bool *)uVar1 = bVar2;
        break;
      case (QMenu *)0x1:
        title(pQVar3);
        QString::operator=((QString *)in_stack_ffffffffffffff20,
                           (QString *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18))
        ;
        QString::~QString((QString *)0x64ebb9);
        break;
      case (QMenu *)0x2:
        icon(pQVar3);
        QIcon::operator=((QIcon *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                         (QIcon *)pQVar3);
        QIcon::~QIcon(local_50);
        break;
      case (QMenu *)0x3:
        bVar2 = separatorsCollapsible((QMenu *)in_stack_ffffffffffffff20);
        *(bool *)uVar1 = bVar2;
        break;
      case (QMenu *)0x4:
        bVar2 = toolTipsVisible((QMenu *)in_stack_ffffffffffffff20);
        *(bool *)uVar1 = bVar2;
      }
      collapse = (undefined1)((ulong)pQVar3 >> 0x38);
    }
    if (in_ESI == 2) {
      pQVar3 = (QMenu *)(ulong)in_EDX;
      switch(pQVar3) {
      case (QMenu *)0x0:
        setTearOffEnabled((QMenu *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                          (bool)collapse);
        break;
      case (QMenu *)0x1:
        setTitle(pQVar3,(QString *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
        break;
      case (QMenu *)0x2:
        setIcon(pQVar3,(QIcon *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
        break;
      case (QMenu *)0x3:
        setSeparatorsCollapsible
                  ((QMenu *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                   (bool)collapse);
        break;
      case (QMenu *)0x4:
        setToolTipsVisible(pQVar3,(bool)in_stack_ffffffffffffff1f);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMenu::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QMenu *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->aboutToShow(); break;
        case 1: _t->aboutToHide(); break;
        case 2: _t->triggered((*reinterpret_cast< std::add_pointer_t<QAction*>>(_a[1]))); break;
        case 3: _t->hovered((*reinterpret_cast< std::add_pointer_t<QAction*>>(_a[1]))); break;
        case 4: _t->internalDelayedPopup(); break;
        case 5: _t->d_func()->_q_actionTriggered(); break;
        case 6: _t->d_func()->_q_actionHovered(); break;
        case 7: _t->d_func()->_q_overrideMenuActionDestroyed(); break;
        case 8: _t->d_func()->_q_platformMenuAboutToShow(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 2:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAction* >(); break;
            }
            break;
        case 3:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAction* >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QMenu::*)()>(_a, &QMenu::aboutToShow, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QMenu::*)()>(_a, &QMenu::aboutToHide, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QMenu::*)(QAction * )>(_a, &QMenu::triggered, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QMenu::*)(QAction * )>(_a, &QMenu::hovered, 3))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->isTearOffEnabled(); break;
        case 1: *reinterpret_cast<QString*>(_v) = _t->title(); break;
        case 2: *reinterpret_cast<QIcon*>(_v) = _t->icon(); break;
        case 3: *reinterpret_cast<bool*>(_v) = _t->separatorsCollapsible(); break;
        case 4: *reinterpret_cast<bool*>(_v) = _t->toolTipsVisible(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setTearOffEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 1: _t->setTitle(*reinterpret_cast<QString*>(_v)); break;
        case 2: _t->setIcon(*reinterpret_cast<QIcon*>(_v)); break;
        case 3: _t->setSeparatorsCollapsible(*reinterpret_cast<bool*>(_v)); break;
        case 4: _t->setToolTipsVisible(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}